

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Intermediate.cpp
# Opt level: O3

void __thiscall glslang::TIntermUnary::updatePrecision(TIntermUnary *this)

{
  uint uVar1;
  undefined8 uVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  
  iVar3 = (*(this->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode
            [0x20])();
  if (((iVar3 != 8) &&
      (iVar3 = (*(this->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                 _vptr_TIntermNode[0x20])(this), iVar3 != 9)) &&
     (iVar3 = (*(this->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode
                [0x20])(this), iVar3 != 1)) {
    return;
  }
  iVar3 = (*(this->operand->super_TIntermNode)._vptr_TIntermNode[0x21])();
  uVar1 = *(uint *)(CONCAT44(extraout_var,iVar3) + 8);
  iVar3 = (*(this->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode
            [0x21])(this);
  if ((*(uint *)(CONCAT44(extraout_var_00,iVar3) + 8) >> 0x19 & 7) < (uVar1 >> 0x19 & 7)) {
    iVar3 = (*(this->operand->super_TIntermNode)._vptr_TIntermNode[0x21])();
    uVar2 = *(undefined8 *)(CONCAT44(extraout_var_01,iVar3) + 8);
    iVar3 = (*(this->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode
              [0x21])(this);
    *(ulong *)(CONCAT44(extraout_var_02,iVar3) + 8) =
         *(ulong *)(CONCAT44(extraout_var_02,iVar3) + 8) & 0xfffffffff1ffffff |
         (ulong)((uint)uVar2 & 0xe000000);
  }
  return;
}

Assistant:

void TIntermUnary::updatePrecision()
{
    if (getBasicType() == EbtInt || getBasicType() == EbtUint ||
        getBasicType() == EbtFloat) {
        if (operand->getQualifier().precision > getQualifier().precision)
            getQualifier().precision = operand->getQualifier().precision;
    }
}